

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
emplace_back<slang::ast::OpaqueInstancePath::Entry>
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,Entry *args)

{
  pointer pEVar1;
  size_type sVar2;
  ulong uVar3;
  pointer pEVar4;
  pointer pEVar5;
  uintptr_t *puVar6;
  pointer pEVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  pointer pEVar10;
  
  pEVar1 = this->data_;
  pEVar10 = pEVar1 + this->len;
  if (this->len != this->cap) {
    pEVar10->value = args->value;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return pEVar1 + sVar2;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0xfffffffffffffff - uVar3 < uVar3) {
    pEVar8 = (EVP_PKEY_CTX *)0xfffffffffffffff;
  }
  lVar9 = (long)pEVar10 - (long)this->data_;
  pEVar4 = (pointer)operator_new((long)pEVar8 * 8);
  *(uintptr_t *)((long)pEVar4 + lVar9) = args->value;
  pEVar7 = this->data_;
  pEVar1 = pEVar7 + this->len;
  pEVar5 = pEVar4;
  if (pEVar1 == pEVar10) {
    for (; pEVar7 != pEVar10; pEVar7 = pEVar7 + 1) {
      pEVar5->value = pEVar7->value;
      pEVar5 = pEVar5 + 1;
    }
  }
  else {
    for (; pEVar7 != pEVar10; pEVar7 = pEVar7 + 1) {
      ctx = (EVP_PKEY_CTX *)pEVar7->value;
      pEVar5->value = (uintptr_t)ctx;
      pEVar5 = pEVar5 + 1;
    }
    puVar6 = (uintptr_t *)(lVar9 + (long)pEVar4);
    for (; puVar6 = puVar6 + 1, pEVar10 != pEVar1; pEVar10 = pEVar10 + 1) {
      *puVar6 = pEVar10->value;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = pEVar4;
  return (reference)((long)pEVar4 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }